

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_175;
  allocator_type local_174;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  Argengine ae;
  int argc_local;
  char **argv_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  code *local_148;
  code *local_140;
  Error error;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  argc_local = argc;
  argv_local = argv;
  juzzlin::Argengine::Argengine(&ae,argc,argv,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"-a",&local_171);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(error.message.field_2._M_local_buf + 8),"--arguments",&local_172);
  __l._M_len = 2;
  __l._M_array = (iterator)&error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_40,__l,&local_173,&local_174);
  local_158._M_allocated_capacity = (size_type)&argc_local;
  local_158._8_8_ = &argv_local;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex1/ex1.cpp:43:32)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex1/ex1.cpp:43:32)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_90,"Print arguments.",&local_175);
  juzzlin::Argengine::addOption(&ae,&local_40,&local_158,0,local_90);
  std::__cxx11::string::~string(local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error.code + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"-p",&local_171);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_70,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_172,(allocator_type *)&local_173);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex1/ex1.cpp:52:17)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex1/ex1.cpp:52:17)>
             ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"Print length of given text. This option is required.",
             (allocator<char> *)&local_174);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"TEXT",&local_175);
  juzzlin::Argengine::addOption(&ae,&local_70,&local_f8,1,local_b0,local_d0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_70);
  std::__cxx11::string::~string((string *)&error);
  error.code = Ok;
  error.message._M_dataplus._M_p = (pointer)&error.message.field_2;
  error.message._M_string_length = 0;
  error.message.field_2._M_local_buf[0] = '\0';
  juzzlin::Argengine::parse((Error *)&ae);
  bVar3 = error.code != Ok;
  if (bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&error.message);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    juzzlin::Argengine::printHelp();
  }
  std::__cxx11::string::~string((string *)&error.message);
  juzzlin::Argengine::~Argengine(&ae);
  return (uint)bVar3;
}

Assistant:

int main(int argc, char ** argv)
{
    // Instantiate Argengine and give it the raw argument data.
    Argengine ae(argc, argv);

    // Add option "-a" that, when set, prints all arguments given to the binary.
    ae.addOption(
      { "-a", "--arguments" }, [&] {
          for (int i = 0; i < argc; i++) {
              std::cout << argv[i] << std::endl;
          }
      },
      false, "Print arguments."); // Set the option non-required and set documentation string.

    // Add option "-p" that prints the length of the given string e.g. "-p FOO".
    ae.addOption(
      { "-p" }, [](std::string value) {
          std::cout << value.size() << std::endl;
      },
      true, "Print length of given text. This option is required.", "TEXT"); // Set the option required and set documentation string and variable name shown in the documentation.

    // Parse the arguments and store possible error to variable error.
    Argengine::Error error;
    ae.parse(error);

    // Check error and print the possible error message.
    if (error.code != Argengine::Error::Code::Ok) {
        std::cerr << error.message << std::endl
                  << std::endl;
        ae.printHelp(); // Print the auto-generated help.
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}